

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O2

void sptk::PrintDataType(string *symbol,ostream *stream)

{
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  string data_type;
  string local_1b8 [32];
  ostringstream oss;
  undefined8 uStack_188;
  uint auStack_180 [88];
  
  std::__cxx11::string::string((string *)&data_type,"",(allocator *)&oss);
  bVar2 = std::operator==("c",symbol);
  if (bVar2) {
LAB_00105a44:
    std::__cxx11::string::assign((char *)&data_type);
  }
  else {
    bVar2 = std::operator==("s",symbol);
    if (bVar2) {
LAB_00105a6d:
      std::__cxx11::string::assign((char *)&data_type);
    }
    else {
      bVar2 = std::operator==("h",symbol);
      if (bVar2) {
LAB_00105a93:
        std::__cxx11::string::assign((char *)&data_type);
      }
      else {
        bVar2 = std::operator==("i",symbol);
        if (bVar2) goto LAB_00105ab9;
        bVar2 = std::operator==("l",symbol);
        if (bVar2) goto LAB_00105ae3;
        bVar2 = std::operator==("C",symbol);
        if (bVar2) goto LAB_00105a44;
        bVar2 = std::operator==("S",symbol);
        if (bVar2) goto LAB_00105a6d;
        bVar2 = std::operator==("H",symbol);
        if (bVar2) goto LAB_00105a93;
        bVar2 = std::operator==("I",symbol);
        if (bVar2) {
LAB_00105ab9:
          std::__cxx11::string::assign((char *)&data_type);
        }
        else {
          bVar2 = std::operator==("L",symbol);
          if (!bVar2) {
            bVar2 = std::operator==("f",symbol);
            if (bVar2) goto LAB_00105ab9;
            bVar2 = std::operator==("d",symbol);
            if (!bVar2) {
              bVar2 = std::operator==("e",symbol);
              if (!bVar2) {
                bVar2 = std::operator==("a",symbol);
                if (bVar2) {
                  std::__cxx11::string::assign((char *)&data_type);
                }
                bVar2 = false;
                goto LAB_00105af2;
              }
              std::__cxx11::string::assign((char *)&data_type);
              goto LAB_00105aed;
            }
          }
LAB_00105ae3:
          std::__cxx11::string::assign((char *)&data_type);
        }
      }
    }
  }
LAB_00105aed:
  bVar2 = true;
LAB_00105af2:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(undefined8 *)((long)&uStack_188 + *(long *)(_oss + -0x18)) = 2;
  *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) =
       *(uint *)((long)auStack_180 + *(long *)(_oss + -0x18)) & 0xffffff4f | 0x20;
  std::operator<<((ostream *)&oss,(string *)symbol);
  if (bVar2) {
    poVar3 = std::operator<<((ostream *)&oss,"(");
    poVar3 = std::operator<<(poVar3,(string *)&data_type);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar4 = "byte)";
  }
  else {
    poVar3 = std::operator<<((ostream *)&oss,"(");
    poVar3 = std::operator<<(poVar3,(string *)&data_type);
    pcVar4 = ")";
  }
  std::operator<<(poVar3,pcVar4);
  lVar1 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar1 + -0x18) + 0x10) = 0x1b;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(stream + lVar1 + 0x18) = *(uint *)(stream + lVar1 + 0x18) & 0xffffff4f | 0x20;
  std::__cxx11::stringbuf::str();
  std::operator<<(stream,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  std::__cxx11::string::~string((string *)&data_type);
  return;
}

Assistant:

void PrintDataType(const std::string& symbol, std::ostream* stream) {
  std::string data_type("");
  std::size_t data_size(0);

  if ("c" == symbol) {
    data_type = "char";
    data_size = sizeof(std::int8_t);
  } else if ("s" == symbol) {
    data_type = "short";
    data_size = sizeof(std::int16_t);
  } else if ("h" == symbol) {
    data_type = "int";
    data_size = sizeof(int24_t);
  } else if ("i" == symbol) {
    data_type = "int";
    data_size = sizeof(std::int32_t);
  } else if ("l" == symbol) {
    data_type = "long";
    data_size = sizeof(std::int64_t);
  } else if ("C" == symbol) {
    data_type = "unsigned char";
    data_size = sizeof(std::uint8_t);
  } else if ("S" == symbol) {
    data_type = "unsigned short";
    data_size = sizeof(std::uint16_t);
  } else if ("H" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(uint24_t);
  } else if ("I" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(std::uint32_t);
  } else if ("L" == symbol) {
    data_type = "unsigned long";
    data_size = sizeof(std::uint64_t);
  } else if ("f" == symbol) {
    data_type = "float";
    data_size = sizeof(float);
  } else if ("d" == symbol) {
    data_type = "double";
    data_size = sizeof(double);
  } else if ("e" == symbol) {
    data_type = "long double";
    data_size = sizeof(long double);
  } else if ("a" == symbol) {
    data_type = "ascii";
  }

  std::ostringstream oss;
  oss << std::setw(2) << std::left << symbol;
  if (0 < data_size) {
    oss << "(" << data_type << ", " << data_size << "byte)";
  } else {
    oss << "(" << data_type << ")";
  }
  *stream << std::setw(27) << std::left << oss.str();
}